

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::generate_serialize_container
          (t_netstd_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  string *psVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  t_netstd_generator *this_00;
  _Alloc_hider _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  string iter;
  string local_138;
  string local_118;
  string *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar5 != '\0') {
      t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_118._M_dataplus._M_p,local_118._M_string_length);
      pcVar7 = "await oprot.WriteSetBeginAsync(new TSet(";
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"await oprot.WriteSetBeginAsync(new TSet(",0x28);
      type_to_enum_abi_cxx11_
                (&local_138,(t_netstd_generator *)pcVar7,*(t_type **)&ttype[1].super_t_doc.has_doc_)
      ;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".Count), ",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                          CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002d4968;
    }
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar5 != '\0') {
      t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_118._M_dataplus._M_p,local_118._M_string_length);
      pcVar7 = "await oprot.WriteListBeginAsync(new TList(";
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"await oprot.WriteListBeginAsync(new TList(",0x2a);
      type_to_enum_abi_cxx11_
                (&local_138,(t_netstd_generator *)pcVar7,*(t_type **)&ttype[1].super_t_doc.has_doc_)
      ;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".Count), ",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                          CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002d4968;
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_118._M_dataplus._M_p,local_118._M_string_length);
    pcVar7 = "await oprot.WriteMapBeginAsync(new TMap(";
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"await oprot.WriteMapBeginAsync(new TMap(",0x28);
    type_to_enum_abi_cxx11_
              (&local_138,(t_netstd_generator *)pcVar7,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_138._M_dataplus._M_p,local_138._M_string_length);
    this_00 = (t_netstd_generator *)0x3a9b9f;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    type_to_enum_abi_cxx11_(&local_f0,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".Count), ",9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                        CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
LAB_002d4968:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_iter","");
  t_generator::tmp(&local_118,(t_generator *)this,&local_50);
  local_f8 = prefix;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar5 != '\0') {
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      psVar4 = local_f8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"foreach (",9);
      type_name_abi_cxx11_(&local_f0,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,true);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_118._M_dataplus._M_p,local_118._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," in ",4);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      goto LAB_002d4c76;
    }
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar5 != '\0') {
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      psVar4 = local_f8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"foreach (",9);
      type_name_abi_cxx11_(&local_f0,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,true);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_118._M_dataplus._M_p,local_118._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," in ",4);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      goto LAB_002d4c76;
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_138._M_dataplus._M_p,local_138._M_string_length);
    psVar4 = local_f8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"foreach (",9);
    type_name_abi_cxx11_(&local_f0,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,true);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," in ",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".Keys)",6);
LAB_002d4c76:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar2 = &local_138.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar5 == '\0') goto LAB_002d4e62;
      paVar9 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      generate_serialize_list_element(this,out,(t_list *)ttype,&local_d0);
      _Var8._M_p = local_d0._M_dataplus._M_p;
    }
    else {
      paVar9 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_b0);
      _Var8._M_p = local_b0._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != paVar9) goto LAB_002d4e5d;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
    pcVar3 = (local_f8->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + local_f8->_M_string_length);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    _Var8._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_002d4e5d:
      operator_delete(_Var8._M_p);
    }
  }
LAB_002d4e62:
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar5 == '\0') goto LAB_002d507f;
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"await oprot.WriteListEndAsync(",0x1e);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                          CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"await oprot.WriteSetEndAsync(",0x1d);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                          CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_138._M_dataplus._M_p,local_138._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"await oprot.WriteMapEndAsync(",0x1d);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                        CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
LAB_002d507f:
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix)
{
    out << indent() << "{" << endl;
    indent_up();

    if (ttype->is_map())
    {
        out << indent() << "await oprot.WriteMapBeginAsync(new TMap(" << type_to_enum(static_cast<t_map*>(ttype)->get_key_type())
            << ", " << type_to_enum(static_cast<t_map*>(ttype)->get_val_type()) << ", " << prefix
            << ".Count), " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "await oprot.WriteSetBeginAsync(new TSet(" << type_to_enum(static_cast<t_set*>(ttype)->get_elem_type())
            << ", " << prefix << ".Count), " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "await oprot.WriteListBeginAsync(new TList("
            << type_to_enum(static_cast<t_list*>(ttype)->get_elem_type()) << ", " << prefix << ".Count), " << CANCELLATION_TOKEN_NAME << ");"
            << endl;
    }

    string iter = tmp("_iter");
    if (ttype->is_map())
    {
        out << indent() << "foreach (" << type_name(static_cast<t_map*>(ttype)->get_key_type()) << " " << iter
            << " in " << prefix << ".Keys)";
    }
    else if (ttype->is_set())
    {
        out << indent() << "foreach (" << type_name(static_cast<t_set*>(ttype)->get_elem_type()) << " " << iter
            << " in " << prefix << ")";
    }
    else if (ttype->is_list())
    {
        out << indent() << "foreach (" << type_name(static_cast<t_list*>(ttype)->get_elem_type()) << " " << iter
            << " in " << prefix << ")";
    }

    out << endl;
    out << indent() << "{" << endl;
    indent_up();

    if (ttype->is_map())
    {
        generate_serialize_map_element(out, static_cast<t_map*>(ttype), iter, prefix);
    }
    else if (ttype->is_set())
    {
        generate_serialize_set_element(out, static_cast<t_set*>(ttype), iter);
    }
    else if (ttype->is_list())
    {
        generate_serialize_list_element(out, static_cast<t_list*>(ttype), iter);
    }

    indent_down();
    out << indent() << "}" << endl;

    if (ttype->is_map())
    {
        out << indent() << "await oprot.WriteMapEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "await oprot.WriteSetEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "await oprot.WriteListEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    indent_down();
    out << indent() << "}" << endl;
}